

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t * convert_run_to_efficient_container(run_container_t *c,uint8_t *typecode_after)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  rle16_t *prVar4;
  uint16_t *puVar5;
  int32_t n_runs;
  uint uVar6;
  long lVar7;
  array_container_t *paVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint8_t uVar13;
  uint16_t uVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  
  iVar3 = c->n_runs;
  uVar6 = croaring_hardware_support();
  if ((uVar6 & 2) == 0) {
    uVar6 = croaring_hardware_support();
    if ((uVar6 & 1) == 0) {
      iVar17 = c->n_runs;
      lVar7 = (long)iVar17;
      if (0 < lVar7) {
        lVar12 = 0;
        do {
          iVar17 = iVar17 + (uint)c->runs[lVar12].length;
          lVar12 = lVar12 + 1;
        } while (lVar7 != lVar12);
      }
    }
    else {
      iVar17 = _avx2_run_container_cardinality(c);
    }
  }
  else {
    iVar17 = _avx512_run_container_cardinality(c);
  }
  iVar10 = 0x1ffe;
  if (iVar17 * 2 < 0x1ffe) {
    iVar10 = iVar17 * 2;
  }
  uVar13 = '\x03';
  paVar8 = (array_container_t *)c;
  if (iVar10 < iVar3 * 4) {
    if (iVar17 < 0x1001) {
      paVar8 = array_container_create_given_capacity(iVar17);
      paVar8->cardinality = 0;
      iVar3 = c->n_runs;
      uVar13 = '\x02';
      if (0 < (long)iVar3) {
        prVar4 = c->runs;
        puVar5 = paVar8->array;
        lVar7 = 0;
        lVar12 = 0;
        do {
          uVar14 = prVar4[lVar7].value;
          uVar1 = prVar4[lVar7].length;
          iVar17 = (int)lVar12;
          lVar12 = (long)iVar17;
          uVar6 = 0;
          do {
            puVar5[lVar12] = uVar14;
            lVar12 = lVar12 + 1;
            uVar6 = uVar6 - 1;
            uVar14 = uVar14 + 1;
          } while (~(uint)uVar1 != uVar6);
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar3);
        paVar8->cardinality = iVar17 - uVar6;
      }
    }
    else {
      paVar8 = (array_container_t *)bitset_container_create();
      iVar3 = c->n_runs;
      if (0 < (long)iVar3) {
        prVar4 = c->runs;
        puVar5 = paVar8->array;
        lVar7 = 0;
        do {
          uVar1 = prVar4[lVar7].value;
          uVar2 = prVar4[lVar7].length;
          if ((uint)uVar2 + (uint)uVar1 + 1 != (uint)uVar1) {
            uVar16 = (uint)uVar2 + (uint)uVar1;
            uVar11 = (uint)(uVar1 >> 6);
            uVar9 = -1L << ((byte)uVar1 & 0x3f);
            uVar6 = uVar16 >> 6;
            bVar15 = (byte)uVar16;
            if (uVar6 - uVar11 == 0) {
              bVar15 = ~bVar15;
              uVar9 = (uVar9 << (bVar15 & 0x3f)) >> (bVar15 & 0x3f);
              uVar6 = uVar11;
            }
            else {
              *(ulong *)(puVar5 + (ulong)uVar11 * 4) =
                   *(ulong *)(puVar5 + (ulong)uVar11 * 4) | uVar9;
              if (uVar11 + 1 < uVar6) {
                memset(puVar5 + (ulong)(uVar1 >> 6) * 4 + 4,0xff,
                       (ulong)((uVar6 - uVar11) - 2) * 8 + 8);
              }
              uVar9 = 0xffffffffffffffff >> (~bVar15 & 0x3f);
            }
            *(ulong *)(puVar5 + (ulong)uVar6 * 4) = *(ulong *)(puVar5 + (ulong)uVar6 * 4) | uVar9;
          }
          lVar7 = lVar7 + 1;
        } while (iVar3 != lVar7);
      }
      paVar8->cardinality = iVar17;
      uVar13 = '\x01';
    }
  }
  *typecode_after = uVar13;
  return paVar8;
}

Assistant:

container_t *convert_run_to_efficient_container(run_container_t *c,
                                                uint8_t *typecode_after) {
    int32_t size_as_run_container =
        run_container_serialized_size_in_bytes(c->n_runs);

    int32_t size_as_bitset_container =
        bitset_container_serialized_size_in_bytes();
    int32_t card = run_container_cardinality(c);
    int32_t size_as_array_container =
        array_container_serialized_size_in_bytes(card);

    int32_t min_size_non_run =
        size_as_bitset_container < size_as_array_container
            ? size_as_bitset_container
            : size_as_array_container;
    if (size_as_run_container <= min_size_non_run) {  // no conversion
        *typecode_after = RUN_CONTAINER_TYPE;
        return c;
    }
    if (card <= DEFAULT_MAX_SIZE) {
        // to array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
            int run_start = c->runs[rlepos].value;
            int run_end = run_start + c->runs[rlepos].length;

            for (int run_value = run_start; run_value <= run_end; ++run_value) {
                answer->array[answer->cardinality++] = (uint16_t)run_value;
            }
        }
        *typecode_after = ARRAY_CONTAINER_TYPE;
        return answer;
    }

    // else to bitset
    bitset_container_t *answer = bitset_container_create();

    for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
        int start = c->runs[rlepos].value;
        int end = start + c->runs[rlepos].length;
        bitset_set_range(answer->words, start, end + 1);
    }
    answer->cardinality = card;
    *typecode_after = BITSET_CONTAINER_TYPE;
    return answer;
}